

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O3

void collect_args_and_func_types(c2m_ctx_t c2m_ctx,func_type *func_type)

{
  ulong uVar1;
  gen_ctx_conflict *pgVar2;
  VARR_MIR_var_t *pVVar3;
  VARR_MIR_type_t *pVVar4;
  long lVar5;
  node_t pnVar6;
  uint uVar7;
  int n_qwords;
  MIR_type_t MVar8;
  MIR_type_t *pMVar9;
  mir_size_t mVar10;
  c2m_ctx_t pcVar11;
  MIR_var_t *pMVar12;
  ulong uVar13;
  ulong uVar14;
  MIR_type_t MVar15;
  char *suffix;
  MIR_type_t promoted_type;
  type *ptVar16;
  c2m_ctx_t pcVar17;
  ulong uVar18;
  char *pcVar19;
  size_t sVar20;
  node_t pnVar21;
  target_arg_info_t arg_info;
  target_arg_info_t local_50;
  gen_ctx_conflict *local_48;
  MIR_type_t local_40 [2];
  c2m_ctx_t local_38;
  
  pgVar2 = c2m_ctx->gen_ctx;
  pVVar3 = (pgVar2->proto_info).arg_vars;
  local_48 = pgVar2;
  if ((pVVar3 == (VARR_MIR_var_t *)0x0) || (pVVar3->varr == (MIR_var_t *)0x0)) {
LAB_0019a7a6:
    collect_args_and_func_types_cold_6();
    pcVar11 = c2m_ctx;
LAB_0019a7ab:
    collect_args_and_func_types_cold_5();
  }
  else {
    pnVar21 = (func_type->param_list->u).ops.head;
    pVVar3->els_num = 0;
    pVVar4 = (pgVar2->proto_info).ret_types;
    pcVar11 = c2m_ctx;
    if ((pVVar4 == (VARR_MIR_type_t *)0x0) || (pVVar4->varr == (MIR_type_t *)0x0))
    goto LAB_0019a7ab;
    pVVar4->els_num = 0;
    (pgVar2->proto_info).res_ref_p = 0;
    local_50.n_iregs = 0;
    local_50.n_fregs = 0;
    set_type_layout(c2m_ctx,func_type->ret_type);
    func_type = (func_type *)func_type->ret_type;
    pVVar4 = (pgVar2->proto_info).ret_types;
    pVVar3 = (pgVar2->proto_info).arg_vars;
    pcVar17 = c2m_ctx;
    local_38 = c2m_ctx;
    if ((((type *)func_type)->mode == TM_BASIC) && ((((type *)func_type)->u).basic_type == TP_VOID))
    {
LAB_0019a5e3:
      if ((pnVar21 != (node_t)0x0) &&
         (((pnVar21->code != N_TYPE ||
           (lVar5 = *(long *)((long)pnVar21->attr + 0x18), *(int *)(lVar5 + 0x18) != 1)) ||
          (*(int *)(lVar5 + 0x30) != 1)))) {
        do {
          if (pnVar21->code == N_TYPE) {
            pcVar19 = "p";
            func_type = *(func_type **)((long)pnVar21->attr + 0x18);
          }
          else {
            pnVar6 = (pnVar21->u).ops.head;
            if (((pnVar6 == (node_t)0x0) || (pnVar21->code != N_SPEC_DECL)) ||
               ((pnVar6 = (pnVar6->op_link).next, pnVar6 == (node_t)0x0 || (pnVar6->code != N_DECL))
               )) {
              __assert_fail("p->code == N_SPEC_DECL && declarator != NULL && declarator->code == N_DECL"
                            ,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                            ,0x2c94,
                            "void collect_args_and_func_types(c2m_ctx_t, struct func_type *)");
            }
            func_type = *(func_type **)((long)pnVar21->attr + 0x40);
            pcVar19 = get_param_name(pcVar17,(type *)func_type,(((pnVar6->u).ops.head)->u).s.s);
          }
          pVVar3 = (local_48->proto_info).arg_vars;
          n_qwords = process_aggregate_arg(pcVar17,(type *)func_type,&local_50,local_40);
          if ((((type *)func_type)->mode & ~TM_BASIC) == TM_STRUCT) {
            MVar15 = get_blk_type(n_qwords,local_40);
            ptVar16 = (type *)func_type;
            pcVar11 = (c2m_ctx_t)raw_type_size(pcVar17,(type *)func_type);
            uVar14 = (ulong)((type *)func_type)->align;
            func_type = (func_type *)ptVar16;
            c2m_ctx = pcVar17;
            if (uVar14 != 0) {
              uVar18 = (long)pcVar11->env[0].__jmpbuf + (uVar14 - 0x11);
              pcVar11 = (c2m_ctx_t)(uVar18 - uVar18 % uVar14);
            }
          }
          else {
            c2m_ctx = pcVar17;
            MVar8 = get_mir_type(pcVar17,(type *)func_type);
            pcVar11 = pcVar17;
            if ((MVar8 & 0x1e) == MIR_T_F) {
              local_50.n_fregs = local_50.n_fregs + 1;
              MVar15 = MVar8;
            }
            else {
              MVar15 = MIR_T_LD;
              if (MVar8 != MIR_T_LD) {
                local_50.n_iregs = local_50.n_iregs + 1;
                MVar15 = MVar8;
              }
            }
          }
          pMVar12 = pVVar3->varr;
          if (pMVar12 == (MIR_var_t *)0x0) {
            collect_args_and_func_types_cold_4();
LAB_0019a7a1:
            collect_args_and_func_types_cold_1();
            goto LAB_0019a7a6;
          }
          sVar20 = pVVar3->els_num;
          uVar14 = sVar20 + 1;
          if (pVVar3->size < uVar14) {
            sVar20 = (uVar14 >> 1) + uVar14;
            pMVar12 = (MIR_var_t *)realloc(pMVar12,sVar20 * 0x18);
            pVVar3->varr = pMVar12;
            pVVar3->size = sVar20;
            sVar20 = pVVar3->els_num;
            uVar14 = sVar20 + 1;
          }
          pVVar3->els_num = uVar14;
          pMVar12[sVar20].type = MVar15;
          pMVar12[sVar20].name = pcVar19;
          pMVar12[sVar20].size = (size_t)pcVar11;
          pnVar21 = (pnVar21->op_link).next;
          pcVar17 = local_38;
        } while (pnVar21 != (node_t)0x0);
      }
      return;
    }
    uVar7 = process_ret_type(c2m_ctx,(type *)func_type,local_40);
    if (uVar7 != 0) {
      if (0 < (int)uVar7) {
        uVar14 = pVVar4->els_num;
        pMVar9 = pVVar4->varr;
        uVar18 = 0;
        do {
          c2m_ctx = (c2m_ctx_t)0x4;
          func_type = (func_type *)0x5;
          MVar8 = local_40[uVar18];
          MVar15 = MVar8 & ~MIR_T_I16;
          if (MVar15 == MIR_T_U8) {
            MVar8 = MIR_T_U32;
          }
          if (MVar15 == MIR_T_I8) {
            MVar8 = MIR_T_I32;
          }
          if (pMVar9 == (MIR_type_t *)0x0) goto LAB_0019a7a1;
          uVar1 = uVar14 + 1;
          uVar13 = uVar14;
          uVar14 = uVar1;
          if (pVVar4->size < uVar1) {
            sVar20 = (uVar1 >> 1) + uVar1;
            pMVar9 = (MIR_type_t *)realloc(pMVar9,sVar20 * 4);
            pVVar4->varr = pMVar9;
            pVVar4->size = sVar20;
            uVar13 = pVVar4->els_num;
            uVar14 = uVar13 + 1;
            pcVar17 = local_38;
          }
          uVar18 = uVar18 + 1;
          pVVar4->els_num = uVar14;
          pMVar9[uVar13] = MVar8;
        } while (uVar7 != uVar18);
      }
      goto LAB_0019a5e3;
    }
    if ((((type *)func_type)->mode & ~TM_BASIC) != TM_STRUCT) {
      MVar8 = get_mir_type(c2m_ctx,(type *)func_type);
      pMVar9 = pVVar4->varr;
      if (pMVar9 != (MIR_type_t *)0x0) {
        sVar20 = pVVar4->els_num;
        uVar14 = sVar20 + 1;
        if (pVVar4->size < uVar14) {
          sVar20 = (uVar14 >> 1) + uVar14;
          pMVar9 = (MIR_type_t *)realloc(pMVar9,sVar20 * 4);
          pVVar4->varr = pMVar9;
          pVVar4->size = sVar20;
          sVar20 = pVVar4->els_num;
          uVar14 = sVar20 + 1;
        }
        pVVar4->els_num = uVar14;
        pMVar9[sVar20] = MVar8;
        goto LAB_0019a5e3;
      }
      goto LAB_0019a7b5;
    }
    ptVar16 = (type *)func_type;
    mVar10 = raw_type_size(c2m_ctx,(type *)func_type);
    uVar14 = (ulong)((type *)func_type)->align;
    if (uVar14 != 0) {
      uVar18 = (mVar10 - 1) + uVar14;
      mVar10 = uVar18 - uVar18 % uVar14;
    }
    pMVar12 = pVVar3->varr;
    func_type = (func_type *)ptVar16;
    if (pMVar12 != (MIR_var_t *)0x0) {
      sVar20 = pVVar3->els_num;
      uVar14 = sVar20 + 1;
      if (pVVar3->size < uVar14) {
        sVar20 = (uVar14 >> 1) + uVar14;
        pMVar12 = (MIR_var_t *)realloc(pMVar12,sVar20 * 0x18);
        pVVar3->varr = pMVar12;
        pVVar3->size = sVar20;
        sVar20 = pVVar3->els_num;
        uVar14 = sVar20 + 1;
      }
      pVVar3->els_num = uVar14;
      pMVar12[sVar20].type = MIR_T_RBLK;
      pMVar12[sVar20].name = "Ret_Addr";
      pMVar12[sVar20].size = mVar10;
      local_50.n_iregs = 1;
      goto LAB_0019a5e3;
    }
  }
  collect_args_and_func_types_cold_3();
LAB_0019a7b5:
  collect_args_and_func_types_cold_2();
  if (pcVar11 != (c2m_ctx_t)0x0) {
    return;
  }
  VARR_MIR_var_taddr_cold_1();
  if (pcVar11 == (c2m_ctx_t)0x0) {
    VARR_MIR_var_tlength_cold_1();
    MVar8 = MIR_T_I64;
    if ((((type *)func_type)->mode & ~TM_BASIC) != TM_STRUCT) {
      MVar8 = get_mir_type(pcVar11,(type *)func_type);
    }
    MVar15 = MIR_T_U32;
    if ((MVar8 & 0x1d) != MIR_T_U8) {
      MVar15 = MVar8;
    }
    promoted_type = MIR_T_I32;
    if ((MVar8 & 0x1d) != MIR_T_I8) {
      promoted_type = MVar15;
    }
    get_reg_var_name(pcVar11,promoted_type,suffix,0);
    return;
  }
  return;
}

Assistant:

static void collect_args_and_func_types (c2m_ctx_t c2m_ctx, struct func_type *func_type) {
  gen_ctx_t gen_ctx = c2m_ctx->gen_ctx;
  node_t declarator, id, first_param, p;
  struct type *param_type;
  decl_t param_decl;
  const char *name;
  target_arg_info_t arg_info;

  first_param = NL_HEAD (func_type->param_list->u.ops);
  VARR_TRUNC (MIR_var_t, proto_info.arg_vars, 0);
  VARR_TRUNC (MIR_type_t, proto_info.ret_types, 0);
  proto_info.res_ref_p = FALSE;
  target_init_arg_vars (c2m_ctx, &arg_info);
  set_type_layout (c2m_ctx, func_type->ret_type);
  target_add_res_proto (c2m_ctx, func_type->ret_type, &arg_info, proto_info.ret_types,
                        proto_info.arg_vars);
  if (first_param != NULL && !void_param_p (first_param)) {
    for (p = first_param; p != NULL; p = NL_NEXT (p)) {
      if (p->code == N_TYPE) {
        name = "p";
        param_type = ((struct decl_spec *) p->attr)->type;
        param_decl = NULL;
      } else {
        declarator = NL_EL (p->u.ops, 1);
        assert (p->code == N_SPEC_DECL && declarator != NULL && declarator->code == N_DECL);
        id = NL_HEAD (declarator->u.ops);
        param_decl = p->attr;
        param_type = param_decl->decl_spec.type;
        name = get_param_name (c2m_ctx, param_type, id->u.s.s);
      }
      target_add_arg_proto (c2m_ctx, name, param_type, &arg_info, proto_info.arg_vars);
    }
  }
}